

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashTable.h
# Opt level: O1

iterator * __thiscall
idx2::IncreaseCapacity<unsigned_long,idx2::file_cache>
          (iterator *__return_storage_ptr__,idx2 *this,
          hash_table<unsigned_long,_idx2::file_cache> *Ht,iterator *ItIn)

{
  char *pcVar1;
  file_cache *pfVar2;
  i64 iVar3;
  iterator iVar4;
  unsigned_long *Key;
  long lVar5;
  hash_table<unsigned_long,_idx2::file_cache> *phVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  file_cache *in_R8;
  iterator Result;
  hash_table<unsigned_long,_idx2::file_cache> NewHt;
  undefined1 local_88 [32];
  hash_table<unsigned_long,_idx2::file_cache> local_68;
  
  pfVar2 = Ht->Vals;
  phVar6 = (hash_table<unsigned_long,_idx2::file_cache> *)Ht->Stats;
  iVar3 = Ht->Size;
  __return_storage_ptr__->Key = Ht->Keys;
  __return_storage_ptr__->Val = pfVar2;
  __return_storage_ptr__->Ht = phVar6;
  __return_storage_ptr__->Idx = iVar3;
  local_68.Keys = (unsigned_long *)0x0;
  local_68.LogCapacity = 0;
  local_68.Alloc = (allocator *)0x0;
  local_68.Vals = SUB328(ZEXT832(0),4);
  local_68.Stats = (bucket_status *)local_68.LogCapacity;
  local_68.Size = (i64)local_68.Alloc;
  Init<unsigned_long,idx2::file_cache>
            (&local_68,*(long *)(this + 0x20) + 1,*(allocator **)(this + 0x28));
  lVar7 = 1L << ((byte)*(long *)(this + 0x20) & 0x3f);
  lVar8 = lVar7;
  if (*(long *)(this + 0x20) != 0x3f) {
    lVar5 = 0;
    lVar9 = 0;
    if (0 < lVar7) {
      lVar9 = lVar7;
    }
    do {
      lVar8 = lVar5;
      if (*(char *)(*(long *)(this + 0x10) + lVar5) == '\x02') break;
      lVar5 = lVar5 + 1;
      lVar8 = lVar7;
    } while (lVar9 + 1 != lVar5);
  }
  if (lVar8 != 1L << ((byte)this[0x20] & 0x3f)) {
    Key = (unsigned_long *)(lVar8 * 0xd0 + *(long *)(this + 8));
    phVar6 = (hash_table<unsigned_long,_idx2::file_cache> *)(lVar8 * 8 + *(long *)this);
    do {
      Insert<unsigned_long,idx2::file_cache>
                ((iterator *)local_88,(idx2 *)&local_68,phVar6,Key,in_R8);
      if (*Ht->Keys == *(unsigned_long *)local_88._0_8_) {
        iVar4.Val = (file_cache *)local_88._8_8_;
        iVar4.Ht = (hash_table<unsigned_long,_idx2::file_cache> *)local_88._16_8_;
        iVar4.Idx = local_88._24_8_;
        iVar4.Key = (unsigned_long *)local_88._0_8_;
        *__return_storage_ptr__ = iVar4;
      }
      lVar7 = lVar8 * -0xd0;
      lVar9 = lVar8 * -8;
      do {
        lVar7 = lVar7 + -0xd0;
        lVar9 = lVar9 + -8;
        pcVar1 = (char *)(*(long *)(this + 0x10) + 1 + lVar8);
        lVar8 = lVar8 + 1;
      } while (*pcVar1 != '\x02');
      phVar6 = (hash_table<unsigned_long,_idx2::file_cache> *)(*(long *)this - lVar9);
      Key = (unsigned_long *)(*(long *)(this + 8) - lVar7);
    } while (1L << ((byte)this[0x20] & 0x3f) != lVar8);
  }
  Dealloc<unsigned_long,idx2::file_cache>((hash_table<unsigned_long,_idx2::file_cache> *)this);
  *(bucket_status **)(this + 0x10) = local_68.Stats;
  *(i64 *)(this + 0x18) = local_68.Size;
  *(i64 *)(this + 0x20) = local_68.LogCapacity;
  *(allocator **)(this + 0x28) = local_68.Alloc;
  *(unsigned_long **)this = local_68.Keys;
  *(file_cache **)(this + 8) = local_68.Vals;
  *(bucket_status **)(this + 0x10) = local_68.Stats;
  *(i64 *)(this + 0x18) = local_68.Size;
  __return_storage_ptr__->Ht = (hash_table<unsigned_long,_idx2::file_cache> *)this;
  return __return_storage_ptr__;
}

Assistant:

typename hash_table<k, v>::iterator
IncreaseCapacity(hash_table<k, v>* Ht, const typename hash_table<k, v>::iterator& ItIn)
{
  auto ItOut = ItIn;
  hash_table<k, v> NewHt;
  Init(&NewHt, Ht->LogCapacity + 1, Ht->Alloc);
  for (auto It = Begin(*Ht); It != End(*Ht); ++It)
  {
    auto Result = Insert(&NewHt, *(It.Key), *(It.Val));
    if (*(ItIn.Key) == *(Result.Key))
      ItOut = Result;
  }
  Dealloc(Ht);
  *Ht = NewHt;
  ItOut.Ht = Ht;
  return ItOut;
}